

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

char rtosc_type(char *msg,uint nargument)

{
  int in_ESI;
  char *in_RDI;
  char *arg;
  char *local_18;
  int local_c;
  
  local_18 = rtosc_argument_string(in_RDI);
  local_c = in_ESI;
  do {
    if ((*local_18 != '[') && (*local_18 != ']')) {
      if ((local_c == 0) || (*local_18 == '\0')) {
        return *local_18;
      }
      local_c = local_c + -1;
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

char rtosc_type(const char *msg, unsigned nargument)
{
    assert(nargument < rtosc_narguments(msg));
    const char *arg = rtosc_argument_string(msg);
    while(1) {
        if(*arg == '[' || *arg == ']')
            ++arg;
        else if(!nargument || !*arg)
            return *arg;
        else
            ++arg, --nargument;
    }
}